

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

int zip_extract(char *zipname,char *dir,_func_int_char_ptr_void_ptr *on_extract,void *arg)

{
  mz_bool mVar1;
  undefined1 local_a0 [8];
  mz_zip_archive zip_archive;
  void *arg_local;
  _func_int_char_ptr_void_ptr *on_extract_local;
  char *dir_local;
  char *zipname_local;
  
  if ((zipname == (char *)0x0) || (dir == (char *)0x0)) {
    zipname_local._4_4_ = -0x16;
  }
  else {
    zip_archive.m_pState = (mz_zip_internal_state *)arg;
    memset(local_a0,0,0x70);
    if (&stack0x00000000 == (undefined1 *)0xa0) {
      zipname_local._4_4_ = -7;
    }
    else {
      mVar1 = mz_zip_reader_init_file((mz_zip_archive *)local_a0,zipname,0);
      if (mVar1 == 0) {
        zipname_local._4_4_ = -1;
      }
      else {
        zipname_local._4_4_ =
             zip_archive_extract((mz_zip_archive *)local_a0,dir,on_extract,zip_archive.m_pState);
      }
    }
  }
  return zipname_local._4_4_;
}

Assistant:

int zip_extract(const char *zipname, const char *dir,
                int (*on_extract)(const char *filename, void *arg), void *arg) {
  mz_zip_archive zip_archive;

  if (!zipname || !dir) {
    // Cannot parse zip archive name
    return ZIP_EINVZIPNAME;
  }

  if (!memset(&zip_archive, 0, sizeof(mz_zip_archive))) {
    // Cannot memset zip archive
    return ZIP_EMEMSET;
  }

  // Now try to open the archive.
  if (!mz_zip_reader_init_file(&zip_archive, zipname, 0)) {
    // Cannot initialize zip_archive reader
    return ZIP_ENOINIT;
  }

  return zip_archive_extract(&zip_archive, dir, on_extract, arg);
}